

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::Shader::Shader(Shader *this)

{
  *(undefined8 *)&(this->super_Item).m_type = 0x600000005;
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Shader_0011ca38;
  this->compileStatus = false;
  (this->source).super_Item.m_type = TYPE_SHADERSOURCE;
  (this->source).super_Item._vptr_Item = (_func_int **)&PTR__ShaderSource_0011ca70;
  (this->source).source._M_dataplus._M_p = (pointer)&(this->source).source.field_2;
  (this->source).source._M_string_length = 0;
  (this->source).source.field_2._M_local_buf[0] = '\0';
  (this->infoLog).super_Item.m_type = TYPE_INFOLOG;
  (this->infoLog).super_Item._vptr_Item = (_func_int **)&PTR__InfoLog_0011ca00;
  (this->infoLog).log._M_dataplus._M_p = (pointer)&(this->infoLog).log.field_2;
  (this->infoLog).log._M_string_length = 0;
  (this->infoLog).log.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Shader				(void) : Item(TYPE_SHADER), shaderType(SHADERTYPE_LAST), compileStatus(false) {}